

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O0

void __thiscall m2d::savanna::ssl_reuse::interface::on_shutdown(interface *this,error_code ec)

{
  bool bVar1;
  bool local_71;
  interface *local_50;
  error_category *local_48;
  error_code local_40;
  error_code local_30;
  interface *local_20;
  interface *this_local;
  error_code ec_local;
  
  ec_local._0_8_ = ec.cat_;
  this_local = ec._0_8_;
  local_20 = this;
  boost::system::error_code::error_code<boost::asio::error::misc_errors>(&local_30,eof,(type *)0x0);
  bVar1 = boost::system::operator==((error_code *)&this_local,&local_30);
  local_71 = true;
  if (!bVar1) {
    boost::system::error_code::error_code<boost::asio::ssl::error::stream_errors>
              (&local_40,stream_truncated,(type *)0x0);
    local_71 = boost::system::operator==((error_code *)&this_local,&local_40);
  }
  if (local_71 != false) {
    boost::system::error_code::error_code((error_code *)&local_50);
    this_local = local_50;
    ec_local._0_8_ = local_48;
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&this_local);
  if (bVar1) {
    (*this->_vptr_interface[8])(this,this_local,ec_local._0_8_);
  }
  else {
    (*this->_vptr_interface[5])(this,this_local,ec_local._0_8_);
  }
  return;
}

Assistant:

void on_shutdown(beast::error_code ec){
			if (ec == net::error::eof || ec == net::ssl::error::stream_truncated) {
				// Rationale:
				// http://stackoverflow.com/questions/25587403/boost-asio-ssl-async-shutdown-always-finishes-with-an-error
				ec = {};
			}
			if (ec) {
				error_callback(ec);
				return;
			}
			on_shutdown_l(ec);
		}